

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_write_string(mbedtls_mpi *X,int radix,char *buf,size_t buflen,size_t *olen)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  char *local_50;
  mbedtls_mpi T;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  sVar3 = mbedtls_mpi_bitlen(X);
  uVar4 = ((sVar3 >> (3U < (uint)radix)) >> (0xfU < (uint)radix) & 0xfffffffffffffffe) + 4;
  if (buflen < uVar4) {
    *olen = uVar4;
    return -8;
  }
  T.s = 1;
  T.n = 0;
  T.p = (mbedtls_mpi_uint *)0x0;
  local_50 = buf;
  if (X->s == -1) {
    local_50 = buf + 1;
    *buf = '-';
  }
  if (radix == 0x10) {
    bVar1 = false;
    pcVar5 = local_50;
    sVar3 = X->n;
    while (sVar7 = sVar3, lVar6 = 0x38, sVar8 = 0xfffffffffffffffa, sVar7 != 0) {
      for (; sVar3 = sVar7 - 1, lVar6 != -8; lVar6 = lVar6 + -8) {
        uVar9 = X->p[sVar7 - 1] >> ((byte)lVar6 & 0x3f);
        uVar4 = uVar9 & 0xff;
        if (((sVar7 == sVar8) || ((int)uVar4 != 0)) || (bVar1)) {
          *pcVar5 = "0123456789ABCDEF"[uVar4 >> 4];
          pcVar5[1] = "0123456789ABCDEF"[(uint)uVar9 & 0xf];
          pcVar5 = pcVar5 + 2;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        sVar8 = sVar8 + 1;
      }
    }
  }
  else {
    iVar2 = mbedtls_mpi_copy(&T,X);
    if (iVar2 != 0) goto LAB_00110b9c;
    if (T.s == -1) {
      T.s = 1;
    }
    iVar2 = mpi_write_hlp(&T,radix,&local_50);
    pcVar5 = local_50;
    if (iVar2 != 0) goto LAB_00110b9c;
  }
  *pcVar5 = '\0';
  *olen = (size_t)(pcVar5 + (1 - (long)buf));
  iVar2 = 0;
LAB_00110b9c:
  mbedtls_mpi_free(&T);
  return iVar2;
}

Assistant:

int mbedtls_mpi_write_string( const mbedtls_mpi *X, int radix,
                              char *buf, size_t buflen, size_t *olen )
{
    int ret = 0;
    size_t n;
    char *p;
    mbedtls_mpi T;

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    n = mbedtls_mpi_bitlen( X );
    if( radix >=  4 ) n >>= 1;
    if( radix >= 16 ) n >>= 1;
    /*
     * Round up the buffer length to an even value to ensure that there is
     * enough room for hexadecimal values that can be represented in an odd
     * number of digits.
     */
    n += 3 + ( ( n + 1 ) & 1 );

    if( buflen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
    }

    p = buf;
    mbedtls_mpi_init( &T );

    if( X->s == -1 )
        *p++ = '-';

    if( radix == 16 )
    {
        int c;
        size_t i, j, k;

        for( i = X->n, k = 0; i > 0; i-- )
        {
            for( j = ciL; j > 0; j-- )
            {
                c = ( X->p[i - 1] >> ( ( j - 1 ) << 3) ) & 0xFF;

                if( c == 0 && k == 0 && ( i + j ) != 2 )
                    continue;

                *(p++) = "0123456789ABCDEF" [c / 16];
                *(p++) = "0123456789ABCDEF" [c % 16];
                k = 1;
            }
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T, X ) );

        if( T.s == -1 )
            T.s = 1;

        MBEDTLS_MPI_CHK( mpi_write_hlp( &T, radix, &p ) );
    }

    *p++ = '\0';
    *olen = p - buf;

cleanup:

    mbedtls_mpi_free( &T );

    return( ret );
}